

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPacking.cpp
# Opt level: O2

bool __thiscall
wasm::MemoryPacking::canSplit
          (MemoryPacking *this,
          unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *segment,
          Referrers *referrers)

{
  Id IVar1;
  Expression *pEVar2;
  bool bVar3;
  pointer ppEVar4;
  Referrers *__range1;
  DataSegment *this_00;
  
  this_00 = (segment->_M_t).
            super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
            super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
            super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
  if (*(char **)((long)&(this_00->super_Named).name + 8) != (char *)0x0) {
    bVar3 = IString::startsWith<7>((IString *)this_00,(char (*) [7])"__llvm");
    if (bVar3) {
      return false;
    }
    this_00 = (segment->_M_t).
              super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t
              .super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
              super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
  }
  ppEVar4 = (referrers->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppEVar4 ==
        (referrers->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      bVar3 = true;
      if (this_00->isPassive == false) {
        bVar3 = this_00->offset->_id == ConstId;
      }
      return bVar3;
    }
    pEVar2 = *ppEVar4;
    IVar1 = pEVar2->_id;
    if (IVar1 == MemoryInitId) {
      if (this_00->isPassive == true) {
        if (*(int *)pEVar2[2].type.id != 0xe) {
          return false;
        }
        if (**(int **)(pEVar2 + 3) != 0xe) {
          return false;
        }
      }
    }
    else {
      if (IVar1 == ArrayNewSegId) {
        return false;
      }
      if (IVar1 == ArrayInitId) {
        return false;
      }
    }
    ppEVar4 = ppEVar4 + 1;
  } while( true );
}

Assistant:

bool MemoryPacking::canSplit(const std::unique_ptr<DataSegment>& segment,
                             const Referrers& referrers) {
  // Don't mess with segments related to llvm coverage tools such as
  // __llvm_covfun. There segments are expected/parsed by external downstream
  // tools (llvm-cov) so they need to be left intact.
  // See https://clang.llvm.org/docs/SourceBasedCodeCoverage.html
  if (segment->name.is() && segment->name.startsWith("__llvm")) {
    return false;
  }

  for (auto* referrer : referrers) {
    if (auto* curr = referrer->dynCast<MemoryInit>()) {
      if (segment->isPassive) {
        // Do not try to split if there is a nonconstant offset or size
        if (!curr->offset->is<Const>() || !curr->size->is<Const>()) {
          return false;
        }
      }
    } else if (referrer->is<ArrayNewSeg>() || referrer->is<ArrayInit>()) {
      // TODO: Split segments referenced by GC instructions.
      return false;
    }
  }

  // Active segments can only be split if they have constant offsets
  return segment->isPassive || segment->offset->is<Const>();
}